

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

string * extractSubDir(string *__return_storage_ptr__,string *absPath,string *currentMoc)

{
  string *__lhs;
  long lVar1;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  string *local_20;
  string *currentMoc_local;
  string *absPath_local;
  string *subDir;
  
  local_21 = 0;
  local_20 = currentMoc;
  currentMoc_local = absPath;
  absPath_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  lVar1 = std::__cxx11::string::find_first_of((char)local_20,0x2f);
  __lhs = currentMoc_local;
  if (lVar1 != -1) {
    cmsys::SystemTools::GetFilenamePath(&local_88,local_20);
    std::operator+(&local_68,__lhs,&local_88);
    std::operator+(&local_48,&local_68,'/');
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string extractSubDir(const std::string& absPath,
                                 const std::string& currentMoc)
{
  std::string subDir;
  if (currentMoc.find_first_of('/') != std::string::npos)
    {
    subDir = absPath
                  + cmsys::SystemTools::GetFilenamePath(currentMoc) + '/';
    }
  return subDir;
}